

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemma_name_reader.cc
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* uttamarin::ReadLemmaNamesFromSpthyFile
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *spthy_file_path)

{
  bool bVar1;
  istream *piVar2;
  ulong uVar3;
  long lVar4;
  char *__filename;
  bool local_39b;
  byte local_39a;
  bool local_38b;
  bool local_38a;
  string local_368;
  string local_348;
  byte local_321;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  byte local_2f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  string local_2d8 [8];
  string line;
  istream local_2b0 [8];
  ifstream tamarin_stream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string tamarin_command;
  string *spthy_file_path_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *lemma_names;
  
  tamarin_command.field_2._8_8_ = spthy_file_path;
  std::operator+(&local_98,"tamarin-prover ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 spthy_file_path);
  std::operator+(&local_78,&local_98," 1> ");
  std::operator+(&local_58,&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 kTamarinTempfilePath_abi_cxx11_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_58," 2> /dev/null");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  ExecuteShellCommand((string *)local_38);
  std::ifstream::ifstream(local_2b0,(string *)kTamarinTempfilePath_abi_cxx11_,_S_in);
  line.field_2._M_local_buf[0xf] = '\0';
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)__return_storage_ptr__);
  std::__cxx11::string::string(local_2d8);
  do {
    local_2f9 = 0;
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_2b0,local_2d8);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    local_38a = false;
    if (bVar1) {
      uVar3 = std::__cxx11::string::size();
      local_38b = true;
      if (4 < uVar3) {
        std::__cxx11::string::substr((ulong)&local_2f8,(ulong)local_2d8);
        local_2f9 = 1;
        local_38b = std::operator!=(&local_2f8,"=====");
      }
      local_38a = local_38b;
    }
    if ((local_2f9 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_2f8);
    }
  } while (local_38a != false);
  while( true ) {
    local_321 = 0;
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_2b0,local_2d8);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    local_39a = 0;
    if (bVar1) {
      uVar3 = std::__cxx11::string::size();
      local_39b = false;
      if (4 < uVar3) {
        std::__cxx11::string::substr((ulong)&local_320,(ulong)local_2d8);
        local_321 = 1;
        local_39b = std::operator==(&local_320,"=====");
      }
      local_39a = local_39b ^ 0xff;
    }
    if ((local_321 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_320);
    }
    if ((local_39a & 1) == 0) break;
    lVar4 = std::__cxx11::string::find((char *)local_2d8,0x175cad);
    if (lVar4 != -1) {
      std::__cxx11::string::string((string *)&local_368,local_2d8);
      ExtractLemmaName(&local_348,&local_368);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)__return_storage_ptr__,(value_type *)&local_348);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::~string((string *)&local_368);
    }
  }
  __filename = (char *)std::__cxx11::string::c_str();
  remove(__filename);
  line.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string(local_2d8);
  if ((line.field_2._M_local_buf[0xf] & 1U) == 0) {
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)__return_storage_ptr__);
  }
  std::ifstream::~ifstream(local_2b0);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

vector<string> ReadLemmaNamesFromSpthyFile(const string& spthy_file_path) {
  string tamarin_command = "tamarin-prover "  + spthy_file_path + 
    " 1> " + kTamarinTempfilePath + " 2> /dev/null";
  ExecuteShellCommand(tamarin_command);

  std::ifstream tamarin_stream {kTamarinTempfilePath, std::ifstream::in};
  vector<string> lemma_names;
  string line;

  // Move stream to begin of lemma name section
  while(std::getline(tamarin_stream, line) && 
        (line.size() < 5 || line.substr(0,5) != "====="));

  // Read lemma names
  while(std::getline(tamarin_stream, line) && 
      !(line.size() >= 5 && line.substr(0,5) == "=====")) {
      if(line.find("steps)") == std::string::npos) continue;
    lemma_names.push_back(ExtractLemmaName(line));
  }

  // Remove temp file
  std::remove(kTamarinTempfilePath.c_str());

  return lemma_names;
}